

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__YCbCr_to_RGB_row(stbi_uc *out,stbi_uc *y,stbi_uc *pcb,stbi_uc *pcr,int count,int step)

{
  int iVar1;
  int cb;
  int cr;
  int b;
  int g;
  int r;
  int y_fixed;
  int i;
  int step_local;
  int count_local;
  stbi_uc *pcr_local;
  stbi_uc *pcb_local;
  stbi_uc *y_local;
  stbi_uc *out_local;
  
  out_local = out;
  for (i = 0; i < count; i = i + 1) {
    iVar1 = (uint)y[i] * 0x100000 + 0x80000;
    r = (int)(iVar1 + (pcr[i] - 0x80) * 0x166f00) >> 0x14;
    g = (int)(iVar1 + (pcr[i] - 0x80) * -0xb6d00 + ((pcb[i] - 0x80) * -0x58200 & 0xffff0000)) >>
        0x14;
    b = (int)(iVar1 + (pcb[i] - 0x80) * 0x1c5a00) >> 0x14;
    if (0xff < (uint)r) {
      if (r < 0) {
        r = 0;
      }
      else {
        r = 0xff;
      }
    }
    if (0xff < (uint)g) {
      if (g < 0) {
        g = 0;
      }
      else {
        g = 0xff;
      }
    }
    if (0xff < (uint)b) {
      if (b < 0) {
        b = 0;
      }
      else {
        b = 0xff;
      }
    }
    *out_local = (stbi_uc)r;
    out_local[1] = (stbi_uc)g;
    out_local[2] = (stbi_uc)b;
    out_local[3] = 0xff;
    out_local = out_local + step;
  }
  return;
}

Assistant:

static void stbi__YCbCr_to_RGB_row(stbi_uc *out, const stbi_uc *y, const stbi_uc *pcb, const stbi_uc *pcr, int count, int step)
{
   int i;
   for (i=0; i < count; ++i) {
      int y_fixed = (y[i] << 20) + (1<<19); // rounding
      int r,g,b;
      int cr = pcr[i] - 128;
      int cb = pcb[i] - 128;
      r = y_fixed +  cr* float2fixed(1.40200f);
      g = y_fixed + (cr*-float2fixed(0.71414f)) + ((cb*-float2fixed(0.34414f)) & 0xffff0000);
      b = y_fixed                               +   cb* float2fixed(1.77200f);
      r >>= 20;
      g >>= 20;
      b >>= 20;
      if ((unsigned) r > 255) { if (r < 0) r = 0; else r = 255; }
      if ((unsigned) g > 255) { if (g < 0) g = 0; else g = 255; }
      if ((unsigned) b > 255) { if (b < 0) b = 0; else b = 255; }
      out[0] = (stbi_uc)r;
      out[1] = (stbi_uc)g;
      out[2] = (stbi_uc)b;
      out[3] = 255;
      out += step;
   }
}